

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

Regexp * duckdb_re2::Regexp::ConcatOrAlternate
                   (RegexpOp op,Regexp **sub,int nsub,ParseFlags flags,bool can_factor)

{
  Regexp *pRVar1;
  Regexp *pRVar2;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar3;
  ulong uVar4;
  uint16_t uVar5;
  int i;
  ulong uVar6;
  uint uVar7;
  Regexp **sub_00;
  PODArray<duckdb_re2::Regexp_*> subcopy;
  __uniq_ptr_impl<duckdb_re2::Regexp_*,_duckdb_re2::PODArray<duckdb_re2::Regexp_*>::Deleter>
  local_40;
  
  uVar5 = (uint16_t)flags;
  if (nsub == 0) {
    pRVar1 = (Regexp *)operator_new(0x28);
    if (op == kRegexpAlternate) {
      pRVar1->op_ = '\x01';
      pRVar1->simple_ = '\0';
      pRVar1->parse_flags_ = uVar5;
      pRVar1->ref_ = 1;
    }
    else {
      pRVar1->op_ = '\x02';
      pRVar1->simple_ = '\0';
      pRVar1->parse_flags_ = uVar5;
      pRVar1->ref_ = 1;
    }
    *(undefined8 *)((long)&pRVar1->down_ + 6) = 0;
    *(undefined8 *)((long)&(pRVar1->arguments).char_class.cc_ + 6) = 0;
    *(undefined8 *)&pRVar1->nsub_ = 0;
    *(undefined8 *)((long)&pRVar1->field_5 + 6) = 0;
    *(undefined2 *)((long)&pRVar1->arguments + 0xe) = 0;
    return pRVar1;
  }
  if (nsub == 1) {
    return *sub;
  }
  subcopy.ptr_._M_t.
  super___uniq_ptr_impl<duckdb_re2::Regexp_*,_duckdb_re2::PODArray<duckdb_re2::Regexp_*>::Deleter>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb_re2::Regexp_**,_duckdb_re2::PODArray<duckdb_re2::Regexp_*>::Deleter>
  .super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::Regexp_*>::Deleter>.
  super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::Regexp_*>::Deleter,_false>._M_head_impl.
  len_ = (_Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::Regexp_*>::Deleter,_false>)0x0;
  subcopy.ptr_._M_t.
  super___uniq_ptr_impl<duckdb_re2::Regexp_*,_duckdb_re2::PODArray<duckdb_re2::Regexp_*>::Deleter>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb_re2::Regexp_**,_duckdb_re2::PODArray<duckdb_re2::Regexp_*>::Deleter>
  ._4_4_ = 0;
  subcopy.ptr_._M_t.
  super___uniq_ptr_impl<duckdb_re2::Regexp_*,_duckdb_re2::PODArray<duckdb_re2::Regexp_*>::Deleter>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb_re2::Regexp_**,_duckdb_re2::PODArray<duckdb_re2::Regexp_*>::Deleter>
  .super__Head_base<0UL,_duckdb_re2::Regexp_**,_false>._M_head_impl = (Regexp **)0x0;
  if (can_factor && op == kRegexpAlternate) {
    PODArray<duckdb_re2::Regexp_*>::PODArray((PODArray<duckdb_re2::Regexp_*> *)&local_40,nsub);
    std::__uniq_ptr_impl<duckdb_re2::Regexp_*,_duckdb_re2::PODArray<duckdb_re2::Regexp_*>::Deleter>
    ::operator=((__uniq_ptr_impl<duckdb_re2::Regexp_*,_duckdb_re2::PODArray<duckdb_re2::Regexp_*>::Deleter>
                 *)&subcopy,&local_40);
    std::unique_ptr<duckdb_re2::Regexp_*[],_duckdb_re2::PODArray<duckdb_re2::Regexp_*>::Deleter>::
    ~unique_ptr((unique_ptr<duckdb_re2::Regexp_*[],_duckdb_re2::PODArray<duckdb_re2::Regexp_*>::Deleter>
                 *)&local_40);
    memmove(subcopy.ptr_._M_t.
            super___uniq_ptr_impl<duckdb_re2::Regexp_*,_duckdb_re2::PODArray<duckdb_re2::Regexp_*>::Deleter>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb_re2::Regexp_**,_duckdb_re2::PODArray<duckdb_re2::Regexp_*>::Deleter>
            .super__Head_base<0UL,_duckdb_re2::Regexp_**,_false>._M_head_impl,sub,(long)nsub << 3);
    sub = subcopy.ptr_._M_t.
          super___uniq_ptr_impl<duckdb_re2::Regexp_*,_duckdb_re2::PODArray<duckdb_re2::Regexp_*>::Deleter>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb_re2::Regexp_**,_duckdb_re2::PODArray<duckdb_re2::Regexp_*>::Deleter>
          .super__Head_base<0UL,_duckdb_re2::Regexp_**,_false>._M_head_impl;
    nsub = FactorAlternation(subcopy.ptr_._M_t.
                             super___uniq_ptr_impl<duckdb_re2::Regexp_*,_duckdb_re2::PODArray<duckdb_re2::Regexp_*>::Deleter>
                             ._M_t.
                             super__Tuple_impl<0UL,_duckdb_re2::Regexp_**,_duckdb_re2::PODArray<duckdb_re2::Regexp_*>::Deleter>
                             .super__Head_base<0UL,_duckdb_re2::Regexp_**,_false>._M_head_impl,nsub,
                             flags);
    if (nsub == 1) {
      pRVar1 = *sub;
      goto LAB_00e9d1cf;
    }
  }
  if (nsub < 0x10000) {
    pRVar1 = (Regexp *)operator_new(0x28);
    pRVar1->op_ = (uint8_t)op;
    pRVar1->simple_ = '\0';
    pRVar1->parse_flags_ = uVar5;
    pRVar1->ref_ = 1;
    *(undefined8 *)&pRVar1->nsub_ = 0;
    *(undefined8 *)((long)&pRVar1->field_5 + 6) = 0;
    *(undefined8 *)((long)&pRVar1->down_ + 6) = 0;
    *(undefined8 *)((long)&(pRVar1->arguments).char_class.cc_ + 6) = 0;
    *(undefined2 *)((long)&pRVar1->arguments + 0xe) = 0;
    AllocSub(pRVar1,nsub);
    if (pRVar1->nsub_ < 2) {
      paVar3 = &pRVar1->field_5;
    }
    else {
      paVar3 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar1->field_5).submany_;
    }
    uVar4 = 0;
    uVar6 = (ulong)(uint)nsub;
    if (nsub < 1) {
      uVar6 = uVar4;
    }
    for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      paVar3[uVar4] = *(anon_union_8_2_3df47e5c_for_Regexp_7 *)(sub + uVar4);
    }
  }
  else {
    uVar7 = (nsub + 0xfffeU) / 0xffff;
    pRVar1 = (Regexp *)operator_new(0x28);
    pRVar1->op_ = (uint8_t)op;
    pRVar1->simple_ = '\0';
    pRVar1->parse_flags_ = uVar5;
    pRVar1->ref_ = 1;
    *(undefined8 *)&pRVar1->nsub_ = 0;
    *(undefined8 *)((long)&pRVar1->field_5 + 6) = 0;
    *(undefined8 *)((long)&pRVar1->down_ + 6) = 0;
    *(undefined8 *)((long)&(pRVar1->arguments).char_class.cc_ + 6) = 0;
    *(undefined2 *)((long)&pRVar1->arguments + 0xe) = 0;
    AllocSub(pRVar1,uVar7);
    if (pRVar1->nsub_ < 2) {
      paVar3 = &pRVar1->field_5;
    }
    else {
      paVar3 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar1->field_5).submany_;
    }
    uVar7 = uVar7 - 1;
    sub_00 = sub;
    for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      pRVar2 = ConcatOrAlternate(op,sub_00,0xffff,flags,false);
      paVar3[uVar6].subone_ = pRVar2;
      sub_00 = sub_00 + 0xffff;
    }
    pRVar2 = ConcatOrAlternate(op,sub + uVar7 * 0xffff,nsub + uVar7 * -0xffff,flags,false);
    paVar3[uVar7].subone_ = pRVar2;
  }
LAB_00e9d1cf:
  std::unique_ptr<duckdb_re2::Regexp_*[],_duckdb_re2::PODArray<duckdb_re2::Regexp_*>::Deleter>::
  ~unique_ptr(&subcopy.ptr_);
  return pRVar1;
}

Assistant:

Regexp* Regexp::ConcatOrAlternate(RegexpOp op, Regexp** sub, int nsub,
                                  ParseFlags flags, bool can_factor) {
  if (nsub == 1)
    return sub[0];

  if (nsub == 0) {
    if (op == kRegexpAlternate)
      return new Regexp(kRegexpNoMatch, flags);
    else
      return new Regexp(kRegexpEmptyMatch, flags);
  }

  PODArray<Regexp*> subcopy;
  if (op == kRegexpAlternate && can_factor) {
    // Going to edit sub; make a copy so we don't step on caller.
    subcopy = PODArray<Regexp*>(nsub);
    memmove(subcopy.data(), sub, nsub * sizeof sub[0]);
    sub = subcopy.data();
    nsub = FactorAlternation(sub, nsub, flags);
    if (nsub == 1) {
      Regexp* re = sub[0];
      return re;
    }
  }

  if (nsub > kMaxNsub) {
    // Too many subexpressions to fit in a single Regexp.
    // Make a two-level tree.  Two levels gets us to 65535^2.
    int nbigsub = (nsub+kMaxNsub-1)/kMaxNsub;
    Regexp* re = new Regexp(op, flags);
    re->AllocSub(nbigsub);
    Regexp** subs = re->sub();
    for (int i = 0; i < nbigsub - 1; i++)
      subs[i] = ConcatOrAlternate(op, sub+i*kMaxNsub, kMaxNsub, flags, false);
    subs[nbigsub - 1] = ConcatOrAlternate(op, sub+(nbigsub-1)*kMaxNsub,
                                          nsub - (nbigsub-1)*kMaxNsub, flags,
                                          false);
    return re;
  }

  Regexp* re = new Regexp(op, flags);
  re->AllocSub(nsub);
  Regexp** subs = re->sub();
  for (int i = 0; i < nsub; i++)
    subs[i] = sub[i];
  return re;
}